

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O0

OCSPRevocationStatus __thiscall
bssl::anon_unknown_18::GetRevocationStatusForCert
          (anon_unknown_18 *this,OCSPResponseData *response_data,ParsedCertificate *cert,
          ParsedCertificate *issuer_certificate,int64_t verify_time_epoch_seconds,
          optional<long> max_age_seconds,ResponseStatus *response_details)

{
  Input raw_tlv;
  bool bVar1;
  ParsedCertificate *out;
  _Storage<long,_true> _Var2;
  Input raw_tlv_00;
  Input single_extensions;
  optional<long> max_age_seconds_00;
  GeneralizedTime *local_170;
  undefined1 local_120 [8];
  OCSPCertID cert_id;
  int local_d8;
  undefined1 auStack_b0 [8];
  OCSPSingleResponse single_response;
  Input *single_response_der;
  const_iterator __end2;
  const_iterator __begin2;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *__range2;
  OCSPRevocationStatus result;
  int64_t verify_time_epoch_seconds_local;
  ParsedCertificate *issuer_certificate_local;
  ParsedCertificate *cert_local;
  OCSPResponseData *response_data_local;
  optional<long> max_age_seconds_local;
  
  __range2._4_4_ = MAX_VALUE;
  *(undefined4 *)
   max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
   super__Optional_payload_base<long>._M_payload = 5;
  out = issuer_certificate;
  _Var2._M_value =
       max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._M_payload._M_value;
  __end2 = ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::begin
                     ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)(this + 0x38));
  single_response_der =
       (Input *)::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::end
                          ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)
                           (this + 0x38));
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
                                *)&single_response_der);
    if (!bVar1) {
      return __range2._4_4_;
    }
    single_response.extensions.data_.size_ =
         (size_t)__gnu_cxx::
                 __normal_iterator<const_bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
                 ::operator*(&__end2);
    OCSPSingleResponse::OCSPSingleResponse((OCSPSingleResponse *)auStack_b0);
    raw_tlv_00.data_.size_ = (size_t)auStack_b0;
    raw_tlv_00.data_.data_ = *(uchar **)(single_response.extensions.data_.size_ + 8);
    bVar1 = ParseOCSPSingleResponse
                      (*(bssl **)single_response.extensions.data_.size_,raw_tlv_00,
                       (OCSPSingleResponse *)out);
    if (bVar1) {
      if (((byte)single_response.next_update.year & 1) != 0) {
        cert_id.serial_number.data_.size_._0_1_ = single_response.next_update.month;
        cert_id.serial_number.data_.size_._1_1_ = single_response.next_update.day;
        cert_id.serial_number.data_.size_._2_1_ = single_response.next_update.hours;
        cert_id.serial_number.data_.size_._3_1_ = single_response.next_update.minutes;
        cert_id.serial_number.data_.size_._4_1_ = single_response.next_update.seconds;
        cert_id.serial_number.data_.size_._5_1_ = single_response.next_update._7_1_;
        cert_id.serial_number.data_.size_._6_1_ = single_response.has_extensions;
        cert_id.serial_number.data_.size_._7_1_ = single_response._55_1_;
        single_extensions.data_.size_ =
             max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload._M_value;
        single_extensions.data_.data_ = single_response.extensions.data_.data_;
        bVar1 = ParseOCSPSingleResponseExtensions
                          ((anon_unknown_18 *)single_response._48_8_,single_extensions,
                           (ResponseStatus *)out);
        if (!bVar1) {
          max_age_seconds_local.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._12_4_ = 2;
          local_d8 = 1;
          goto LAB_005e7bc6;
        }
      }
      OCSPCertID::OCSPCertID((OCSPCertID *)local_120);
      raw_tlv.data_.size_ = (size_t)single_response.cert_id_tlv.data_.data_;
      raw_tlv.data_.data_ = (uchar *)auStack_b0;
      bVar1 = ParseOCSPCertID(raw_tlv,(OCSPCertID *)local_120);
      if (bVar1) {
        bVar1 = CheckCertIDMatchesCertificate
                          ((OCSPCertID *)local_120,(ParsedCertificate *)response_data,cert);
        if (bVar1) {
          if (((byte)single_response.this_update.year & 1) == 0) {
            local_170 = (GeneralizedTime *)0x0;
          }
          else {
            local_170 = (GeneralizedTime *)&single_response.this_update.month;
          }
          max_age_seconds_00.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value =
               CONCAT71(max_age_seconds_local.super__Optional_base<long,_true,_true>._M_payload.
                        super__Optional_payload_base<long>._M_payload._M_value._1_7_,
                        (char)response_details) & 0xffffffff;
          max_age_seconds_00.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._8_8_ = _Var2._M_value;
          out = (ParsedCertificate *)verify_time_epoch_seconds;
          bVar1 = CheckRevocationDateValid
                            ((bssl *)&single_response.cert_status.has_reason,local_170,
                             (GeneralizedTime *)issuer_certificate,verify_time_epoch_seconds,
                             max_age_seconds_00);
          if (bVar1) {
            if (((*(int *)max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>._M_payload != 2) ||
                (__range2._4_4_ == GOOD)) ||
               ((OCSPRevocationStatus)single_response.cert_id_tlv.data_.size_ == REVOKED)) {
              __range2._4_4_ = (OCSPRevocationStatus)single_response.cert_id_tlv.data_.size_;
            }
            *(undefined4 *)
             max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload = 2;
            local_d8 = 0;
          }
          else {
            if (*(int *)max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
                        super__Optional_payload_base<long>._M_payload != 2) {
              *(undefined4 *)
               max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload = 6;
            }
            local_d8 = 3;
          }
        }
        else {
          local_d8 = 3;
        }
      }
      else {
        max_age_seconds_local.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._12_4_ = 2;
        local_d8 = 1;
      }
      OCSPCertID::~OCSPCertID((OCSPCertID *)local_120);
    }
    else {
      max_age_seconds_local.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._12_4_ = 2;
      local_d8 = 1;
    }
LAB_005e7bc6:
    OCSPSingleResponse::~OCSPSingleResponse((OCSPSingleResponse *)auStack_b0);
    if ((local_d8 != 0) && (local_d8 == 1)) {
      return max_age_seconds_local.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._12_4_;
    }
    __gnu_cxx::
    __normal_iterator<const_bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

OCSPRevocationStatus GetRevocationStatusForCert(
    const OCSPResponseData &response_data, const ParsedCertificate *cert,
    const ParsedCertificate *issuer_certificate,
    int64_t verify_time_epoch_seconds, std::optional<int64_t> max_age_seconds,
    OCSPVerifyResult::ResponseStatus *response_details) {
  OCSPRevocationStatus result = OCSPRevocationStatus::UNKNOWN;
  *response_details = OCSPVerifyResult::NO_MATCHING_RESPONSE;

  for (const auto &single_response_der : response_data.responses) {
    // In the common case, there should only be one SingleResponse in the
    // ResponseData (matching the certificate requested and used on this
    // connection). However, it is possible for the OCSP responder to provide
    // multiple responses for multiple certificates. Look through all the
    // provided SingleResponses, and check to see if any match the
    // certificate. A SingleResponse matches a certificate if it has the same
    // serial number, issuer name (hash), and issuer public key (hash).
    OCSPSingleResponse single_response;
    if (!ParseOCSPSingleResponse(single_response_der, &single_response)) {
      return OCSPRevocationStatus::UNKNOWN;
    }

    // Reject unhandled critical extensions in SingleResponse
    if (single_response.has_extensions &&
        !ParseOCSPSingleResponseExtensions(single_response.extensions,
                                           response_details)) {
      return OCSPRevocationStatus::UNKNOWN;
    }

    OCSPCertID cert_id;
    if (!ParseOCSPCertID(single_response.cert_id_tlv, &cert_id)) {
      return OCSPRevocationStatus::UNKNOWN;
    }
    if (!CheckCertIDMatchesCertificate(cert_id, cert, issuer_certificate)) {
      continue;
    }

    // The SingleResponse matches the certificate, but may be out of date. Out
    // of date responses are noted seperate from responses with mismatched
    // serial numbers. If an OCSP responder provides both an up to date
    // response and an expired response, the up to date response takes
    // precedence (PROVIDED > INVALID_DATE).
    if (!CheckRevocationDateValid(single_response.this_update,
                                  single_response.has_next_update
                                      ? &single_response.next_update
                                      : nullptr,
                                  verify_time_epoch_seconds, max_age_seconds)) {
      if (*response_details != OCSPVerifyResult::PROVIDED) {
        *response_details = OCSPVerifyResult::INVALID_DATE;
      }
      continue;
    }

    // In the case with multiple matching and up to date responses, keep only
    // the strictest status (REVOKED > UNKNOWN > GOOD).
    if (*response_details != OCSPVerifyResult::PROVIDED ||
        result == OCSPRevocationStatus::GOOD ||
        single_response.cert_status.status == OCSPRevocationStatus::REVOKED) {
      result = single_response.cert_status.status;
    }
    *response_details = OCSPVerifyResult::PROVIDED;
  }

  return result;
}